

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_srv.c
# Opt level: O0

int ssl_parse_client_dh_public(mbedtls_ssl_context *ssl,uchar **p,uchar *end)

{
  int ret_00;
  size_t ilen;
  size_t n;
  int ret;
  uchar *end_local;
  uchar **p_local;
  mbedtls_ssl_context *ssl_local;
  
  if (end < *p + 2) {
    mbedtls_debug_print_msg
              (ssl,1,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_srv.c"
               ,0xb6e,"bad client key exchange message");
    ssl_local._4_4_ = -0x7c00;
  }
  else {
    ilen = (size_t)(int)(uint)CONCAT11(**p,(*p)[1]);
    *p = *p + 2;
    if (end < *p + ilen) {
      mbedtls_debug_print_msg
                (ssl,1,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_srv.c"
                 ,0xb77,"bad client key exchange message");
      ssl_local._4_4_ = -0x7c00;
    }
    else {
      ret_00 = mbedtls_dhm_read_public(&ssl->handshake->dhm_ctx,*p,ilen);
      if (ret_00 == 0) {
        *p = *p + ilen;
        mbedtls_debug_print_mpi
                  (ssl,3,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_srv.c"
                   ,0xb83,"DHM: GY",&(ssl->handshake->dhm_ctx).GY);
        ssl_local._4_4_ = 0;
      }
      else {
        mbedtls_debug_print_ret
                  (ssl,1,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_srv.c"
                   ,0xb7d,"mbedtls_dhm_read_public",ret_00);
        ssl_local._4_4_ = -0x7c80;
      }
    }
  }
  return ssl_local._4_4_;
}

Assistant:

static int ssl_parse_client_dh_public( mbedtls_ssl_context *ssl, unsigned char **p,
                                       const unsigned char *end )
{
    int ret = MBEDTLS_ERR_SSL_FEATURE_UNAVAILABLE;
    size_t n;

    /*
     * Receive G^Y mod P, premaster = (G^Y)^X mod P
     */
    if( *p + 2 > end )
    {
        MBEDTLS_SSL_DEBUG_MSG( 1, ( "bad client key exchange message" ) );
        return( MBEDTLS_ERR_SSL_BAD_HS_CLIENT_KEY_EXCHANGE );
    }

    n = ( (*p)[0] << 8 ) | (*p)[1];
    *p += 2;

    if( *p + n > end )
    {
        MBEDTLS_SSL_DEBUG_MSG( 1, ( "bad client key exchange message" ) );
        return( MBEDTLS_ERR_SSL_BAD_HS_CLIENT_KEY_EXCHANGE );
    }

    if( ( ret = mbedtls_dhm_read_public( &ssl->handshake->dhm_ctx, *p, n ) ) != 0 )
    {
        MBEDTLS_SSL_DEBUG_RET( 1, "mbedtls_dhm_read_public", ret );
        return( MBEDTLS_ERR_SSL_BAD_HS_CLIENT_KEY_EXCHANGE_RP );
    }

    *p += n;

    MBEDTLS_SSL_DEBUG_MPI( 3, "DHM: GY", &ssl->handshake->dhm_ctx.GY );

    return( ret );
}